

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
          (PipelineResourceLayoutDescX *this,PipelineResourceLayoutDescX *param_1)

{
  PipelineResourceLayoutDescX *param_1_local;
  PipelineResourceLayoutDescX *this_local;
  
  memcpy(this,param_1,0x28);
  std::
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ::vector(&this->VarCopy,&param_1->VarCopy);
  std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
  vector(&this->ImtblSamCopy,&param_1->ImtblSamCopy);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool,&param_1->StringPool);
  return;
}

Assistant:

PipelineResourceLayoutDescX(PipelineResourceLayoutDescX&&) noexcept = default;